

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void Map_Destroy(Map *tree)

{
  void *pvVar1;
  uint local_3c;
  uint i;
  Map *current_node;
  Stack nodes;
  Stack path;
  Map *tree_local;
  
  Stack_Init((Stack *)&nodes.size);
  Stack_Init((Stack *)&current_node);
  Stack_Push((Stack *)&nodes.size,tree);
  Stack_Push((Stack *)&current_node,tree);
  while (path.first != (Stack_Node *)0x0) {
    pvVar1 = Stack_Pop((Stack *)&nodes.size);
    *(long *)((long)pvVar1 + 0x808) = (long)pvVar1 + 0x808;
    for (local_3c = 0; local_3c < 0x100; local_3c = local_3c + 1) {
      if ((*(long *)((long)pvVar1 + (ulong)local_3c * 8 + 8) != 0) &&
         (*(long *)(*(long *)((long)pvVar1 + (ulong)local_3c * 8 + 8) + 0x808) !=
          *(long *)((long)pvVar1 + (ulong)local_3c * 8 + 8) + 0x808)) {
        Stack_Push((Stack *)&nodes.size,*(void **)((long)pvVar1 + (ulong)local_3c * 8 + 8));
        *(long *)(*(long *)((long)pvVar1 + (ulong)local_3c * 8 + 8) + 0x808) =
             *(long *)((long)pvVar1 + (ulong)local_3c * 8 + 8) + 0x808;
        Stack_Push((Stack *)&current_node,*(void **)((long)pvVar1 + (ulong)local_3c * 8 + 8));
      }
    }
  }
  while ((Stack_Node *)0x1 < nodes.first) {
    pvVar1 = Stack_Pop((Stack *)&current_node);
    free(pvVar1);
  }
  Stack_Pop((Stack *)&current_node);
  return;
}

Assistant:

void Map_Destroy(Map *tree)
{
	Stack path;
	Stack nodes;
	Map *current_node;
	unsigned int i;
	 

	Stack_Init(&path);
	Stack_Init(&nodes);

	Stack_Push(&path,tree);
	Stack_Push(&nodes,tree);

	/*
	   using DFS we fill up the nodes stack with all the used
	   (accessible) nodes.
	 */
	while(path.size>0)
	{
		current_node=Stack_Pop(&path);
		current_node->ID=&(current_node->ID);/*mark the node*/
		for(i=0;i<256;++i)
		{
			if(current_node->delta[i]!=NULL && current_node->delta[i]->ID != &(current_node->delta[i]->ID) )
			{
				Stack_Push(&path,current_node->delta[i]);


				/*we mark the unmarked child of the current_node*/
				current_node->delta[i]->ID=&(current_node->delta[i]->ID);
				/*every node in nodes continues to be marked*/
				Stack_Push(&nodes,current_node->delta[i]);
			}
		}
		
	}
	/*
	   There should not be any duplicates in here
	 */
	while(nodes.size>1)
	{
		current_node=Stack_Pop(&nodes);
		/*Again the things that ID points to is not freed ( this structure is used to map the structure of data )
		  deletion of it is up to you.
		 */
		free(current_node);
	}
	/*this is where the root is at- we don't delete it , but we must free the last stack node*/
	Stack_Pop(&nodes);


}